

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O3

timestamp_t __thiscall
duckdb::DateTruncBinaryOperator::Operation<duckdb::string_t,duckdb::date_t,duckdb::timestamp_t>
          (DateTruncBinaryOperator *this,string_t specifier,date_t date)

{
  DatePartSpecifier DVar1;
  bool bVar2;
  date_t input;
  timestamp_t tVar3;
  NotImplementedException *this_00;
  undefined4 in_register_0000000c;
  long lVar4;
  undefined1 auVar5 [12];
  timestamp_t result;
  timestamp_t local_80;
  string local_78;
  string local_58;
  undefined8 local_38;
  long local_30;
  
  local_30 = specifier.value._0_8_;
  input.days = specifier.value._8_4_;
  lVar4 = local_30;
  if ((uint)this < 0xd) {
    lVar4 = (long)&local_38 + 4;
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = this;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,lVar4,((ulong)this & 0xffffffff) + lVar4,
             CONCAT44(in_register_0000000c,date.days));
  DVar1 = GetDatePartSpecifier(&local_58);
  bVar2 = Value::IsFinite<duckdb::date_t>(input);
  if (bVar2) {
    switch(DVar1) {
    case BEGIN_BIGINT:
      tVar3 = DateTrunc::YearOperator::Operation<duckdb::date_t,duckdb::timestamp_t>(input);
      break;
    case MONTH:
      tVar3 = DateTrunc::MonthOperator::Operation<duckdb::date_t,duckdb::timestamp_t>(input);
      break;
    case DECADE:
      tVar3 = DateTrunc::DecadeOperator::Operation<duckdb::date_t,duckdb::timestamp_t>(input);
      break;
    case CENTURY:
      tVar3 = DateTrunc::CenturyOperator::Operation<duckdb::date_t,duckdb::timestamp_t>(input);
      break;
    case MILLENNIUM:
      tVar3 = DateTrunc::MillenniumOperator::Operation<duckdb::date_t,duckdb::timestamp_t>(input);
      break;
    case WEEK:
    case YEARWEEK:
      input = Date::GetMondayOfCurrentWeek(input);
    case DAY:
    case MICROSECONDS:
    case MILLISECONDS:
    case SECOND:
    case MINUTE:
    case HOUR:
    case DOW:
    case ISODOW:
    case DOY:
    case BEGIN_DOUBLE:
    case JULIAN_DAY:
      tVar3 = Timestamp::FromDatetime(input,(dtime_t)0x0);
      break;
    case ISOYEAR:
      tVar3 = DateTrunc::ISOYearOperator::Operation<duckdb::date_t,duckdb::timestamp_t>(input);
      break;
    case QUARTER:
      tVar3 = DateTrunc::QuarterOperator::Operation<duckdb::date_t,duckdb::timestamp_t>(input);
      break;
    default:
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"Specifier type not implemented for DATETRUNC","");
      NotImplementedException::NotImplementedException(this_00,&local_78);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    bVar2 = TryCast::Operation<duckdb::date_t,duckdb::timestamp_t>(input,&local_80,false);
    tVar3.value = local_80.value;
    if (!bVar2) {
      auVar5 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::date_t,duckdb::timestamp_t>
                (&local_78,(duckdb *)(ulong)(uint)input.days,(date_t)auVar5._8_4_);
      InvalidInputException::InvalidInputException(auVar5._0_8_,&local_78);
      __cxa_throw(auVar5._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return (timestamp_t)tVar3.value;
}

Assistant:

static inline TR Operation(TA specifier, TB date) {
		return TruncateElement<TB, TR>(GetDatePartSpecifier(specifier.GetString()), date);
	}